

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
          (ShaderOptimizationCase *this,Context *context,char *name,char *description,
          CaseShaderType caseShaderType)

{
  gles3::TestCase::TestCase(&this->super_TestCase,context,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOptimizationCase_01e3e488;
  this->m_caseShaderType = caseShaderType;
  this->m_state = STATE_LAST;
  deqp::gls::ShaderPerformanceMeasurer::ShaderPerformanceMeasurer
            (&this->m_measurer,context->m_renderCtx,(uint)(caseShaderType != CASESHADERTYPE_VERTEX))
  ;
  memset(&this->m_unoptimizedData,0,0xac);
  (this->m_unoptimizedData).sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unoptimizedData).sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_unoptimizedData).sources.transformFeedbackVaryings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_unoptimizedData).sources.transformFeedbackVaryings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->m_optimizedData).sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_optimizedData).sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_optimizedData).sources.transformFeedbackVaryings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_optimizedData).sources.transformFeedbackVaryings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  memset(&(this->m_unoptimizedData).attributes,0,0xc4);
  (this->m_optimizedData).attributes.
  super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_optimizedData).attributes.
  super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_optimizedProgram).m_state = (SharedPtrStateBase *)0x0;
  (this->m_optimizedData).attributes.
  super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_unoptimizedProgram).m_ptr = (ShaderProgram *)0x0;
  (this->m_unoptimizedProgram).m_state = (SharedPtrStateBase *)0x0;
  (this->m_optimizedProgram).m_ptr = (ShaderProgram *)0x0;
  (this->m_unoptimizedResult).megaVertPerSec = -1.0;
  (this->m_unoptimizedResult).megaFragPerSec = -1.0;
  (this->m_optimizedResult).megaVertPerSec = -1.0;
  (this->m_optimizedResult).megaFragPerSec = -1.0;
  return;
}

Assistant:

ShaderOptimizationCase (Context& context, const char* name, const char* description, CaseShaderType caseShaderType)
		: TestCase				(context, tcu::NODETYPE_PERFORMANCE, name, description)
		, m_caseShaderType		(caseShaderType)
		, m_state				(STATE_LAST)
		, m_measurer			(context.getRenderContext(), caseShaderType == CASESHADERTYPE_VERTEX	? gls::CASETYPE_VERTEX
														   : caseShaderType == CASESHADERTYPE_FRAGMENT	? gls::CASETYPE_FRAGMENT
														   : gls::CASETYPE_LAST)
		, m_unoptimizedResult	(-1.0f, -1.0f)
		, m_optimizedResult		(-1.0f, -1.0f)
	{
	}